

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
* __thiscall
vkt::shaderexecutor::
generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
          (Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
           *__return_storage_ptr__,shaderexecutor *this,
          Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *samplings,FloatFormat *floatFormat,Precision intPrecision,size_t numSamples,deUint32 seed
          )

{
  iterator iVar1;
  iterator iVar2;
  undefined4 uVar3;
  shaderexecutor *psVar4;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *pSVar5;
  const_iterator cVar6;
  long lVar7;
  long lVar8;
  undefined4 in_register_00000084;
  ulong uVar9;
  ulong uVar10;
  In1 in1;
  In3 in3;
  In2 in2;
  InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  tuple;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  fixedInputs;
  In0 in0;
  set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  seenInputs;
  Random rnd;
  float local_148;
  Void local_142;
  Void local_141;
  undefined1 local_140 [17];
  Void local_12f [7];
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *local_128;
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *local_120;
  vector<float,std::allocator<float>> *local_118;
  undefined4 local_10c;
  void *local_108;
  void *pvStack_100;
  long local_f8;
  void *pvStack_f0;
  void *local_e8;
  long lStack_e0;
  void *local_d8;
  void *pvStack_d0;
  long local_c8;
  void *pvStack_c0;
  void *local_b8;
  long lStack_b0;
  long local_a8;
  value_type local_9c;
  shaderexecutor *local_90;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *local_88;
  ulong local_80;
  ulong local_78;
  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  local_70;
  deRandom local_40;
  
  local_a8 = CONCAT44(in_register_00000084,intPrecision);
  local_10c = SUB84(floatFormat,0);
  deRandom_init(&local_40,(deUint32)numSamples);
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = (void *)0x0;
  lStack_b0 = 0;
  local_c8 = 0;
  pvStack_c0 = (void *)0x0;
  local_d8 = (void *)0x0;
  pvStack_d0 = (void *)0x0;
  local_e8 = (void *)0x0;
  lStack_e0 = 0;
  local_f8 = 0;
  pvStack_f0 = (void *)0x0;
  local_108 = (void *)0x0;
  pvStack_100 = (void *)0x0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  (**(code **)**(undefined8 **)this)(*(undefined8 **)this,samplings);
  (**(code **)**(undefined8 **)(this + 8))(*(undefined8 **)(this + 8),samplings,&pvStack_f0);
  (**(code **)**(undefined8 **)(this + 0x10))(*(undefined8 **)(this + 0x10),samplings,&local_d8);
  (**(code **)**(undefined8 **)(this + 0x18))(*(undefined8 **)(this + 0x18),samplings,&pvStack_c0);
  local_90 = this;
  local_88 = samplings;
  if (pvStack_100 != local_108) {
    local_118 = (vector<float,std::allocator<float>> *)&__return_storage_ptr__->in1;
    local_120 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in2;
    local_128 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in3;
    lVar8 = 0;
    uVar10 = 0;
    do {
      local_80 = uVar10;
      if (local_e8 != pvStack_f0) {
        uVar10 = 0;
        do {
          if (pvStack_d0 != local_d8) {
            uVar9 = 0;
            do {
              local_78 = uVar9;
              if (local_b8 != pvStack_c0) {
                uVar9 = 0;
                do {
                  lVar7 = 0;
                  do {
                    *(undefined4 *)(local_140 + lVar7 * 4) =
                         *(undefined4 *)((long)local_108 + lVar7 * 4 + lVar8);
                    lVar7 = lVar7 + 1;
                  } while (lVar7 != 3);
                  local_140._12_4_ = *(float *)((long)pvStack_f0 + uVar10 * 4);
                  std::
                  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
                  ::
                  _M_insert_unique<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>const&>
                            ((_Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
                              *)&local_70,
                             (InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                              *)local_140);
                  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                  push_back(&__return_storage_ptr__->in0,(value_type *)local_140);
                  iVar1._M_current =
                       (__return_storage_ptr__->in1).
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar1._M_current ==
                      (__return_storage_ptr__->in1).
                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              (local_118,iVar1,(float *)(local_140 + 0xc));
                  }
                  else {
                    *iVar1._M_current = (float)local_140._12_4_;
                    (__return_storage_ptr__->in1).super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                  }
                  iVar2._M_current =
                       (__return_storage_ptr__->in2).
                       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar2._M_current ==
                      (__return_storage_ptr__->in2).
                      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>
                    ::_M_realloc_insert<vkt::shaderexecutor::Void_const&>
                              (local_120,iVar2,(Void *)(local_140 + 0x10));
                  }
                  else {
                    (__return_storage_ptr__->in2).
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                  }
                  iVar2._M_current =
                       (__return_storage_ptr__->in3).
                       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar2._M_current ==
                      (__return_storage_ptr__->in3).
                      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>
                    ::_M_realloc_insert<vkt::shaderexecutor::Void_const&>(local_128,iVar2,local_12f)
                    ;
                  }
                  else {
                    (__return_storage_ptr__->in3).
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar9 < (ulong)((long)local_b8 - (long)pvStack_c0));
              }
              uVar9 = local_78 + 1;
            } while (uVar9 < (ulong)((long)pvStack_d0 - (long)local_d8));
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < (ulong)((long)local_e8 - (long)pvStack_f0 >> 2));
      }
      uVar10 = local_80 + 1;
      lVar8 = lVar8 + 0xc;
    } while (uVar10 < (ulong)(((long)pvStack_100 - (long)local_108 >> 2) * -0x5555555555555555));
  }
  pSVar5 = local_88;
  psVar4 = local_90;
  uVar3 = local_10c;
  if (local_a8 != 0) {
    local_118 = (vector<float,std::allocator<float>> *)&__return_storage_ptr__->in1;
    local_120 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in2;
    local_128 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in3;
    do {
      (**(code **)(**(long **)psVar4 + 8))(&local_9c,*(long **)psVar4,pSVar5,uVar3,&local_40);
      local_148 = (float)(**(code **)(**(long **)(psVar4 + 8) + 8))
                                   (*(long **)(psVar4 + 8),pSVar5,uVar3,&local_40);
      (**(code **)(**(long **)(psVar4 + 0x10) + 8))
                (*(long **)(psVar4 + 0x10),pSVar5,uVar3,&local_40);
      (**(code **)(**(long **)(psVar4 + 0x18) + 8))
                (*(long **)(psVar4 + 0x18),pSVar5,uVar3,&local_40);
      local_140._8_4_ = local_9c.m_data[2];
      local_140._0_4_ = local_9c.m_data[0];
      local_140._4_4_ = local_9c.m_data[1];
      local_140._12_4_ = local_148;
      cVar6 = std::
              _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
              ::find(&local_70,(key_type *)local_140);
      if ((_Rb_tree_header *)cVar6._M_node == &local_70._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
        ::
        _M_insert_unique<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>const&>
                  ((_Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
                    *)&local_70,(key_type *)local_140);
        std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                  (&__return_storage_ptr__->in0,&local_9c);
        iVar1._M_current =
             (__return_storage_ptr__->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    (local_118,iVar1,&local_148);
        }
        else {
          *iVar1._M_current = local_148;
          (__return_storage_ptr__->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar2._M_current =
             (__return_storage_ptr__->in2).
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->in2).
            super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>::
          _M_realloc_insert<vkt::shaderexecutor::Void_const&>(local_120,iVar2,&local_141);
        }
        else {
          (__return_storage_ptr__->in2).
          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar2._M_current =
             (__return_storage_ptr__->in3).
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->in3).
            super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>::
          _M_realloc_insert<vkt::shaderexecutor::Void_const&>(local_128,iVar2,&local_142);
        }
        else {
          (__return_storage_ptr__->in3).
          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
      local_a8 = local_a8 + -1;
    } while (local_a8 != 0);
  }
  std::
  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  ::~_Rb_tree(&local_70);
  if (pvStack_c0 != (void *)0x0) {
    operator_delete(pvStack_c0,lStack_b0 - (long)pvStack_c0);
  }
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8,local_c8 - (long)local_d8);
  }
  if (pvStack_f0 != (void *)0x0) {
    operator_delete(pvStack_f0,lStack_e0 - (long)pvStack_f0);
  }
  if (local_108 != (void *)0x0) {
    operator_delete(local_108,local_f8 - (long)local_108);
  }
  return __return_storage_ptr__;
}

Assistant:

Inputs<In> generateInputs (const Samplings<In>&	samplings,
						   const FloatFormat&	floatFormat,
						   Precision			intPrecision,
						   size_t				numSamples,
						   deUint32				seed)
{
	Random										rnd(seed);
	Inputs<In>									ret;
	Inputs<In>									fixedInputs;
	set<InTuple<In>, InputLess<InTuple<In> > >	seenInputs;

	samplings.in0.genFixeds(floatFormat, fixedInputs.in0);
	samplings.in1.genFixeds(floatFormat, fixedInputs.in1);
	samplings.in2.genFixeds(floatFormat, fixedInputs.in2);
	samplings.in3.genFixeds(floatFormat, fixedInputs.in3);

	for (size_t ndx0 = 0; ndx0 < fixedInputs.in0.size(); ++ndx0)
	{
		for (size_t ndx1 = 0; ndx1 < fixedInputs.in1.size(); ++ndx1)
		{
			for (size_t ndx2 = 0; ndx2 < fixedInputs.in2.size(); ++ndx2)
			{
				for (size_t ndx3 = 0; ndx3 < fixedInputs.in3.size(); ++ndx3)
				{
					const InTuple<In>	tuple	(fixedInputs.in0[ndx0],
												 fixedInputs.in1[ndx1],
												 fixedInputs.in2[ndx2],
												 fixedInputs.in3[ndx3]);

					seenInputs.insert(tuple);
					ret.in0.push_back(tuple.a);
					ret.in1.push_back(tuple.b);
					ret.in2.push_back(tuple.c);
					ret.in3.push_back(tuple.d);
				}
			}
		}
	}

	for (size_t ndx = 0; ndx < numSamples; ++ndx)
	{
		const typename In::In0	in0		= samplings.in0.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In1	in1		= samplings.in1.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In2	in2		= samplings.in2.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In3	in3		= samplings.in3.genRandom(floatFormat, intPrecision, rnd);
		const InTuple<In>		tuple	(in0, in1, in2, in3);

		if (de::contains(seenInputs, tuple))
			continue;

		seenInputs.insert(tuple);
		ret.in0.push_back(in0);
		ret.in1.push_back(in1);
		ret.in2.push_back(in2);
		ret.in3.push_back(in3);
	}

	return ret;
}